

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

StartsWithMatcher *
Catch::Matchers::StartsWith
          (StartsWithMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  undefined1 auStack_38 [40];
  
  StdString::CasedString::CasedString((CasedString *)auStack_38,str,caseSensitivity);
  StdString::StartsWithMatcher::StartsWithMatcher(__return_storage_ptr__,(CasedString *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return __return_storage_ptr__;
}

Assistant:

StdString::StartsWithMatcher StartsWith(std::string const &str, CaseSensitive::Choice caseSensitivity) {
      return StdString::StartsWithMatcher(StdString::CasedString(str, caseSensitivity));
    }